

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB.cpp
# Opt level: O0

ErrorCode PDB::ValidateFile(void *data)

{
  int iVar1;
  SuperBlock *__s1;
  SuperBlock *superBlock;
  void *data_local;
  
  __s1 = Pointer::Offset<PDB::SuperBlock_const*,void_const,unsigned_int>(data,0);
  iVar1 = memcmp(__s1,"Microsoft C/C++ MSF 7.00\r\n\x1aDS",0x1e);
  if (iVar1 == 0) {
    if ((__s1->freeBlockMapIndex == 1) || (__s1->freeBlockMapIndex == 2)) {
      data_local._4_4_ = Success;
    }
    else {
      data_local._4_4_ = InvalidFreeBlockMap;
    }
  }
  else {
    data_local._4_4_ = InvalidSuperBlock;
  }
  return data_local._4_4_;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::ValidateFile(const void* data) PDB_NO_EXCEPT
{
	// validate the super block
	const SuperBlock* superBlock = Pointer::Offset<const SuperBlock*>(data, 0u);
	{
		// validate header magic
		if (std::memcmp(superBlock->fileMagic, SuperBlock::MAGIC, sizeof(SuperBlock::MAGIC)) != 0)
		{
			return ErrorCode::InvalidSuperBlock;
		}

		// validate free block map.
		// the free block map should always reside at either index 1 or 2.
		if (superBlock->freeBlockMapIndex != 1u && superBlock->freeBlockMapIndex != 2u)
		{
			return ErrorCode::InvalidFreeBlockMap;
		}
	}

	return ErrorCode::Success;
}